

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

CordzInfo * absl::lts_20250127::cord_internal::CordzInfo::Head(CordzSnapshot *snapshot)

{
  bool bVar1;
  anon_class_1_0_00000001 local_21;
  __pointer_type local_20;
  CordzInfo *head;
  CordzHandle *local_10;
  CordzSnapshot *snapshot_local;
  
  local_10 = (CordzHandle *)snapshot;
  bVar1 = CordzHandle::is_snapshot((CordzHandle *)snapshot);
  if (!bVar1) {
    Head::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&head + 7));
  }
  local_20 = std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::load
                       ((atomic<absl::lts_20250127::cord_internal::CordzInfo_*> *)(global_list_ + 8)
                        ,memory_order_acquire);
  bVar1 = CordzHandle::DiagnosticsHandleIsSafeToInspect(local_10,&local_20->super_CordzHandle);
  if (!bVar1) {
    Head::anon_class_1_0_00000001::operator()(&local_21);
  }
  return local_20;
}

Assistant:

CordzInfo* CordzInfo::Head(const CordzSnapshot& snapshot) {
  ABSL_ASSERT(snapshot.is_snapshot());

  // We can do an 'unsafe' load of 'head', as we are guaranteed that the
  // instance it points to is kept alive by the provided CordzSnapshot, so we
  // can simply return the current value using an acquire load.
  // We do enforce in DEBUG builds that the 'head' value is present in the
  // delete queue: ODR violations may lead to 'snapshot' and 'global_list_'
  // being in different libraries / modules.
  CordzInfo* head = global_list_.head.load(std::memory_order_acquire);
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(head));
  return head;
}